

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_asn1.cc
# Opt level: O1

ECDSA_SIG * ecdsa_sig_from_fixed(EC_KEY *key,uint8_t *in,size_t len)

{
  uint len_00;
  EC_GROUP *group;
  BIGNUM *bn;
  ECDSA_SIG *sig;
  BIGNUM *pBVar1;
  int reason;
  int line;
  
  group = (EC_GROUP *)EC_KEY_get0_group((EC_KEY *)key);
  if (group == (EC_GROUP *)0x0) {
    reason = 0x43;
    line = 0x23;
  }
  else {
    bn = EC_GROUP_get0_order(group);
    len_00 = BN_num_bytes(bn);
    if ((ulong)len_00 * 2 == len) {
      sig = ECDSA_SIG_new();
      if (((sig != (ECDSA_SIG *)0x0) &&
          (pBVar1 = BN_bin2bn(in,len_00,sig->r), pBVar1 != (BIGNUM *)0x0)) &&
         (pBVar1 = BN_bin2bn(in + len_00,len_00,sig->s), pBVar1 != (BIGNUM *)0x0)) {
        return (ECDSA_SIG *)sig;
      }
      ECDSA_SIG_free(sig);
      return (ECDSA_SIG *)0x0;
    }
    reason = 100;
    line = 0x28;
  }
  ERR_put_error(0x1a,0,reason,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/ecdsa/ecdsa_asn1.cc"
                ,line);
  return (ECDSA_SIG *)0x0;
}

Assistant:

static ECDSA_SIG *ecdsa_sig_from_fixed(const EC_KEY *key, const uint8_t *in,
                                       size_t len) {
  const EC_GROUP *group = EC_KEY_get0_group(key);
  if (group == NULL) {
    OPENSSL_PUT_ERROR(ECDSA, ERR_R_PASSED_NULL_PARAMETER);
    return NULL;
  }
  size_t scalar_len = BN_num_bytes(EC_GROUP_get0_order(group));
  if (len != 2 * scalar_len) {
    OPENSSL_PUT_ERROR(ECDSA, ECDSA_R_BAD_SIGNATURE);
    return NULL;
  }
  ECDSA_SIG *ret = ECDSA_SIG_new();
  if (ret == NULL || !BN_bin2bn(in, scalar_len, ret->r) ||
      !BN_bin2bn(in + scalar_len, scalar_len, ret->s)) {
    ECDSA_SIG_free(ret);
    return NULL;
  }
  return ret;
}